

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__decode_uint8_linear_ARGB(float *decodep,int width_times_channels,void *inputp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint5 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float *pfVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  __m128i zero;
  __m128 of3;
  __m128 of2;
  __m128 of1;
  __m128 of0;
  __m128i o3;
  __m128i o2;
  __m128i o1;
  __m128i o0;
  __m128i i;
  uchar *end_input_m16;
  uchar *input;
  float *decode_end;
  float *decode;
  void *inputp_local;
  int width_times_channels_local;
  float *decodep_local;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  byte local_78;
  byte bStack_77;
  byte bStack_76;
  byte bStack_75;
  byte bStack_74;
  byte bStack_73;
  byte bStack_72;
  byte bStack_71;
  byte bStack_50;
  undefined1 uStack_4f;
  byte bStack_4e;
  byte bStack_4d;
  byte bStack_4c;
  undefined1 uStack_4b;
  byte bStack_4a;
  byte bStack_49;
  int local_48;
  uint uStack_44;
  uint uStack_3c;
  int local_38;
  uint uStack_34;
  uint uStack_2c;
  uint uStack_24;
  uint uStack_1c;
  uint uStack_14;
  uint uStack_c;
  
  pfVar8 = decodep + width_times_channels;
  if (width_times_channels < 0x10) {
    end_input_m16 = (uchar *)inputp;
    for (decode_end = decodep + 4; decode_end <= pfVar8; decode_end = decode_end + 4) {
      decode_end[-4] = (float)end_input_m16[1];
      decode_end[-3] = (float)end_input_m16[2];
      decode_end[-2] = (float)end_input_m16[3];
      decode_end[-1] = (float)*end_input_m16;
      end_input_m16 = end_input_m16 + 4;
    }
  }
  else {
    end_input_m16 = (uchar *)inputp;
    decode_end = decodep;
    do {
      do {
        uVar1 = *(undefined8 *)end_input_m16;
        uVar2 = *(undefined8 *)(end_input_m16 + 8);
        local_78 = (byte)uVar1;
        bStack_77 = (byte)((ulong)uVar1 >> 8);
        bStack_76 = (byte)((ulong)uVar1 >> 0x10);
        bStack_75 = (byte)((ulong)uVar1 >> 0x18);
        bStack_74 = (byte)((ulong)uVar1 >> 0x20);
        bStack_73 = (byte)((ulong)uVar1 >> 0x28);
        bStack_72 = (byte)((ulong)uVar1 >> 0x30);
        bStack_71 = (byte)((ulong)uVar1 >> 0x38);
        bStack_50 = (byte)uVar2;
        uStack_4f = (undefined1)((ulong)uVar2 >> 8);
        bStack_4e = (byte)((ulong)uVar2 >> 0x10);
        bStack_4d = (byte)((ulong)uVar2 >> 0x18);
        bStack_4c = (byte)((ulong)uVar2 >> 0x20);
        uStack_4b = (undefined1)((ulong)uVar2 >> 0x28);
        bStack_4a = (byte)((ulong)uVar2 >> 0x30);
        bStack_49 = (byte)((ulong)uVar2 >> 0x38);
        uStack_14 = (uint)bStack_77;
        uStack_c = (uint)bStack_75;
        uStack_24 = (uint)bStack_73;
        uStack_1c = (uint)bStack_71;
        uVar3 = CONCAT14(uStack_4f,(uint)CONCAT12(uStack_4f,(ushort)bStack_50)) & 0xff0000ffff;
        local_38 = (int)uVar3;
        uStack_34 = (uint)(byte)(uVar3 >> 0x20);
        uStack_2c = (uint)bStack_4d;
        uVar3 = CONCAT14(uStack_4b,(uint)CONCAT12(uStack_4b,(ushort)bStack_4c)) & 0xff0000ffff;
        local_48 = (int)uVar3;
        uStack_44 = (uint)(byte)(uVar3 >> 0x20);
        uStack_3c = (uint)bStack_49;
        zero[1] = CONCAT44((float)uStack_44,(float)local_48);
        auVar7._8_4_ = (float)bStack_76;
        auVar7._12_4_ = (float)uStack_c;
        auVar7._0_4_ = (float)local_78;
        auVar7._4_4_ = (float)uStack_14;
        auVar10._0_12_ = auVar7._4_12_;
        auVar10._12_4_ = (float)local_78;
        local_118 = auVar7._4_8_;
        uStack_110 = auVar10._8_8_;
        auVar6._8_4_ = (float)bStack_72;
        auVar6._12_4_ = (float)uStack_1c;
        auVar6._0_4_ = (float)bStack_74;
        auVar6._4_4_ = (float)uStack_24;
        auVar11._0_12_ = auVar6._4_12_;
        auVar11._12_4_ = (float)bStack_74;
        local_128 = auVar6._4_8_;
        uStack_120 = auVar11._8_8_;
        auVar5._8_4_ = (float)bStack_4e;
        auVar5._12_4_ = (float)uStack_2c;
        auVar5._0_4_ = (float)local_38;
        auVar5._4_4_ = (float)uStack_34;
        auVar12._0_12_ = auVar5._4_12_;
        auVar12._12_4_ = (float)local_38;
        local_138 = auVar5._4_8_;
        uStack_130 = auVar12._8_8_;
        auVar4._8_4_ = (float)bStack_4a;
        auVar4._12_4_ = (float)uStack_3c;
        auVar4._0_8_ = zero[1];
        auVar13._0_12_ = auVar4._4_12_;
        auVar13._12_4_ = (float)local_48;
        local_148 = auVar4._4_8_;
        uStack_140 = auVar13._8_8_;
        *(undefined8 *)decode_end = local_118;
        *(undefined8 *)(decode_end + 2) = uStack_110;
        *(undefined8 *)(decode_end + 4) = local_128;
        *(undefined8 *)(decode_end + 6) = uStack_120;
        *(undefined8 *)(decode_end + 8) = local_138;
        *(undefined8 *)(decode_end + 10) = uStack_130;
        *(undefined8 *)(decode_end + 0xc) = local_148;
        *(undefined8 *)(decode_end + 0xe) = uStack_140;
        decode_end = decode_end + 0x10;
        end_input_m16 = end_input_m16 + 0x10;
      } while (decode_end <= pfVar8 + -0x10);
      bVar9 = decode_end != pfVar8;
      end_input_m16 = (uchar *)((long)inputp + (long)width_times_channels + -0x10);
      decode_end = pfVar8 + -0x10;
    } while (bVar9);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_uint8_linear)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  unsigned char const * input = (unsigned char const*)inputp;

  #ifdef STBIR_SIMD
  unsigned char const * end_input_m16 = input + width_times_channels - 16;
  if ( width_times_channels >= 16 )
  {
    decode_end -= 16;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      #ifdef STBIR_SIMD8
      stbir__simdi i; stbir__simdi8 o0,o1;
      stbir__simdf8 of0, of1;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi8_expand_u8_to_u32( o0, o1, i );
      stbir__simdi8_convert_i32_to_float( of0, o0 );
      stbir__simdi8_convert_i32_to_float( of1, o1 );
      stbir__decode_simdf8_flip( of0 );
      stbir__decode_simdf8_flip( of1 );
      stbir__simdf8_store( decode + 0, of0 );
      stbir__simdf8_store( decode + 8, of1 );
      #else
      stbir__simdi i, o0, o1, o2, o3;
      stbir__simdf of0, of1, of2, of3;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi_expand_u8_to_u32( o0,o1,o2,o3,i);
      stbir__simdi_convert_i32_to_float( of0, o0 );
      stbir__simdi_convert_i32_to_float( of1, o1 );
      stbir__simdi_convert_i32_to_float( of2, o2 );
      stbir__simdi_convert_i32_to_float( of3, o3 );
      stbir__decode_simdf4_flip( of0 );
      stbir__decode_simdf4_flip( of1 );
      stbir__decode_simdf4_flip( of2 );
      stbir__decode_simdf4_flip( of3 );
      stbir__simdf_store( decode + 0,  of0 );
      stbir__simdf_store( decode + 4,  of1 );
      stbir__simdf_store( decode + 8,  of2 );
      stbir__simdf_store( decode + 12, of3 );
#endif
      decode += 16;
      input += 16;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 16 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m16;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = ((float)(input[stbir__decode_order0]));
    decode[1-4] = ((float)(input[stbir__decode_order1]));
    decode[2-4] = ((float)(input[stbir__decode_order2]));
    decode[3-4] = ((float)(input[stbir__decode_order3]));
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = ((float)(input[stbir__decode_order0]));
    #if stbir__coder_min_num >= 2
    decode[1] = ((float)(input[stbir__decode_order1]));
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = ((float)(input[stbir__decode_order2]));
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}